

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_subtract_sse2.c
# Opt level: O0

void aom_highbd_subtract_block_sse2
               (int rows,int cols,int16_t *diff,ptrdiff_t diff_stride,uint8_t *src8,
               ptrdiff_t src_stride,uint8_t *pred8,ptrdiff_t pred_stride)

{
  SubtractWxHFuncType p_Var1;
  ptrdiff_t in_RCX;
  int16_t *in_RDX;
  int in_ESI;
  int in_EDI;
  long in_R8;
  ptrdiff_t in_R9;
  SubtractWxHFuncType func;
  uint16_t *pred;
  uint16_t *src;
  
  p_Var1 = getSubtractFunc(in_EDI,in_ESI);
  (*p_Var1)(in_RDX,in_RCX,(uint16_t *)(in_R8 << 1),in_R9,(uint16_t *)((long)func << 1),
            (ptrdiff_t)pred);
  return;
}

Assistant:

void aom_highbd_subtract_block_sse2(int rows, int cols, int16_t *diff,
                                    ptrdiff_t diff_stride, const uint8_t *src8,
                                    ptrdiff_t src_stride, const uint8_t *pred8,
                                    ptrdiff_t pred_stride) {
  uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *pred = CONVERT_TO_SHORTPTR(pred8);
  SubtractWxHFuncType func;

  func = getSubtractFunc(rows, cols);
  func(diff, diff_stride, src, src_stride, pred, pred_stride);
}